

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int make_table_recurse(archive_read *a,huffman_code *code,int node,huffman_table_entry *table,
                      int depth,int maxdepth)

{
  long lVar1;
  int depth_00;
  uint uVar2;
  int *in_RCX;
  int in_EDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int in_R8D;
  int in_R9D;
  int ret;
  int i;
  int currtablesize;
  uint local_3c;
  int in_stack_ffffffffffffffc8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  local_3c = 0;
  lVar1._0_4_ = (in_RSI->archive).magic;
  lVar1._4_4_ = (in_RSI->archive).state;
  if (lVar1 == 0) {
    archive_set_error(in_RDI,0x54,"Huffman tree was not created.");
    local_4 = 0xffffffe2;
  }
  else if ((in_EDX < 0) || (*(int *)&(in_RSI->archive).vtable <= in_EDX)) {
    archive_set_error(in_RDI,0x54,"Invalid location to Huffman tree specified.");
    local_4 = 0xffffffe2;
  }
  else {
    depth_00 = 1 << ((char)in_R9D - (char)in_R8D & 0x1fU);
    if (*(int *)(*(long *)&in_RSI->archive + (long)in_EDX * 8) ==
        *(int *)(*(long *)&in_RSI->archive + 4 + (long)in_EDX * 8)) {
      for (iVar3 = 0; iVar3 < depth_00; iVar3 = iVar3 + 1) {
        in_RCX[(long)iVar3 * 2] = in_R8D;
        in_RCX[(long)iVar3 * 2 + 1] = *(int *)(*(long *)&in_RSI->archive + (long)in_EDX * 8);
      }
    }
    else if (in_EDX < 0) {
      for (iVar3 = 0; iVar3 < depth_00; iVar3 = iVar3 + 1) {
        in_RCX[(long)iVar3 * 2] = -1;
      }
    }
    else if (in_R8D == in_R9D) {
      *in_RCX = in_R9D + 1;
      in_RCX[1] = in_EDX;
    }
    else {
      uVar2 = make_table_recurse(in_RSI,(huffman_code *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                 (int)((ulong)in_RCX >> 0x20),
                                 (huffman_table_entry *)CONCAT44(in_R8D,in_R9D),depth_00,
                                 in_stack_ffffffffffffffc8);
      local_3c = make_table_recurse(in_RSI,(huffman_code *)
                                           CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                                    (int)((ulong)in_RCX >> 0x20),
                                    (huffman_table_entry *)CONCAT44(in_R8D,in_R9D),depth_00,
                                    in_stack_ffffffffffffffc8);
      local_3c = local_3c | uVar2;
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static int
make_table_recurse(struct archive_read *a, struct huffman_code *code, int node,
                   struct huffman_table_entry *table, int depth,
                   int maxdepth)
{
  int currtablesize, i, ret = (ARCHIVE_OK);

  if (!code->tree)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Huffman tree was not created.");
    return (ARCHIVE_FATAL);
  }
  if (node < 0 || node >= code->numentries)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid location to Huffman tree specified.");
    return (ARCHIVE_FATAL);
  }

  currtablesize = 1 << (maxdepth - depth);

  if (code->tree[node].branches[0] ==
    code->tree[node].branches[1])
  {
    for(i = 0; i < currtablesize; i++)
    {
      table[i].length = depth;
      table[i].value = code->tree[node].branches[0];
    }
  }
  else if (node < 0)
  {
    for(i = 0; i < currtablesize; i++)
      table[i].length = -1;
  }
  else
  {
    if(depth == maxdepth)
    {
      table[0].length = maxdepth + 1;
      table[0].value = node;
    }
    else
    {
      ret |= make_table_recurse(a, code, code->tree[node].branches[0], table,
                                depth + 1, maxdepth);
      ret |= make_table_recurse(a, code, code->tree[node].branches[1],
                         table + currtablesize / 2, depth + 1, maxdepth);
    }
  }
  return ret;
}